

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

int Abs_GiaSortNodes(Gia_Man_t *p,Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int i;
  
  iVar1 = vSupp->nSize;
  iVar2 = iVar1;
  for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(vSupp,iVar4);
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      iVar2 = vSupp->nSize;
      break;
    }
    if (iVar4 < iVar1) {
      iVar2 = Gia_ObjRefNum(p,pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p,pGVar3);
        if (iVar2 == 0) {
          if ((pGVar3->field_0x7 & 0x40) == 0) {
            __assert_fail("pObj->fMark1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                          ,0x1b1,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
          }
          iVar2 = Gia_ObjId(p,pGVar3);
          Vec_IntPush(vSupp,iVar2);
        }
      }
    }
    iVar2 = vSupp->nSize;
  }
  i = 0;
  iVar4 = iVar2;
  do {
    if (iVar4 <= i) {
LAB_004fcb99:
      if (iVar4 != iVar1 * 2) {
        __assert_fail("Vec_IntSize(vSupp) == 2 * nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                      ,0x1b8,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
      }
      memmove(vSupp->pArray,vSupp->pArray + iVar1,(long)iVar1 << 2);
      if (iVar1 <= vSupp->nSize) {
        vSupp->nSize = iVar1;
        return iVar2 - iVar1;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    iVar4 = Vec_IntEntry(vSupp,i);
    pGVar3 = Gia_ManObj(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      iVar4 = vSupp->nSize;
      goto LAB_004fcb99;
    }
    if (i < iVar1) {
      iVar4 = Gia_ObjRefNum(p,pGVar3);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsRo(p,pGVar3);
        if (iVar4 == 0) goto LAB_004fcb8e;
      }
      iVar4 = Gia_ObjId(p,pGVar3);
      Vec_IntPush(vSupp,iVar4);
    }
LAB_004fcb8e:
    i = i + 1;
    iVar4 = vSupp->nSize;
  } while( true );
}

Assistant:

int Abs_GiaSortNodes( Gia_Man_t * p, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int nSize = Vec_IntSize(vSupp);
    int i, RetValue;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj) ) // add removable leaves
        {
            assert( pObj->fMark1 );
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        }
    RetValue = Vec_IntSize(vSupp) - nSize;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && !(Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj)) ) // add non-removable leaves
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
    assert( Vec_IntSize(vSupp) == 2 * nSize );
    memmove( Vec_IntArray(vSupp), Vec_IntArray(vSupp) + nSize, sizeof(int) * nSize );
    Vec_IntShrink( vSupp, nSize );
    return RetValue;
}